

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

bool __thiscall BamTools::Internal::BamStandardIndex::Create(BamStandardIndex *this)

{
  bool bVar1;
  int iVar2;
  uint64_t uVar3;
  int64_t iVar4;
  ostream *poVar5;
  BamReaderPrivate *pBVar6;
  string *this_00;
  undefined4 uVar7;
  undefined4 uVar8;
  allocator local_3f5;
  uint32_t currentBin;
  int local_3f0;
  uint local_3ec;
  uint64_t lastOffset;
  uint64_t currentOffset;
  uint64_t local_3d8;
  int local_3cc;
  BaiReferenceEntry refEntry;
  string local_378;
  string indexFilename;
  int local_334;
  string local_330;
  string readerError;
  string message;
  undefined4 local_e0;
  int local_dc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8 [10];
  
  pBVar6 = (this->super_BamIndex).m_reader;
  if ((pBVar6 == (BamReaderPrivate *)0x0) || (bVar1 = BamReaderPrivate::IsOpen(pBVar6), !bVar1)) {
    std::__cxx11::string::string
              ((string *)&readerError,"BamStandardIndex::Create",(allocator *)&refEntry);
    std::__cxx11::string::string
              ((string *)&message,"could not create index: reader is not open",
               (allocator *)&indexFilename);
    BamIndex::SetErrorString(&this->super_BamIndex,&readerError,&message);
  }
  else {
    bVar1 = BamReaderPrivate::Rewind((this->super_BamIndex).m_reader);
    if (bVar1) {
      BamReaderPrivate::Filename_abi_cxx11_(&readerError,(this->super_BamIndex).m_reader);
      Extension_abi_cxx11_();
      std::operator+(&indexFilename,&readerError,&message);
      std::__cxx11::string::~string((string *)&message);
      std::__cxx11::string::~string((string *)&readerError);
      OpenFile(this,&indexFilename,ReadWrite);
      iVar2 = BamReaderPrivate::GetReferenceCount((this->super_BamIndex).m_reader);
      local_334 = iVar2;
      ReserveForSummary(this,&local_334);
      WriteHeader(this);
      currentBin = 0xffffffff;
      uVar3 = BamReaderPrivate::Tell((this->super_BamIndex).m_reader);
      lastOffset = uVar3;
      currentOffset = uVar3;
      local_3cc = iVar2;
      BamAlignment::BamAlignment((BamAlignment *)&message);
      refEntry.Bins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &refEntry.Bins._M_t._M_impl.super__Rb_tree_header._M_header;
      refEntry.ID = -1;
      refEntry.Bins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      refEntry.Bins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      refEntry.Bins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      refEntry.LinearOffsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      refEntry.LinearOffsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      refEntry.LinearOffsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3f0 = -1;
      local_3ec = 0xffffffff;
      uVar7 = -1;
      uVar8 = -1;
      local_3d8 = uVar3;
      refEntry.Bins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           refEntry.Bins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        pBVar6 = (this->super_BamIndex).m_reader;
        bVar1 = BamReaderPrivate::LoadNextAlignment(pBVar6,(BamAlignment *)&message);
        if (!bVar1) break;
        if (uVar8 == local_e0) {
          if (local_3f0 <= local_dc) goto LAB_0019a89c;
          std::__cxx11::stringstream::stringstream((stringstream *)&readerError);
          poVar5 = std::operator<<((ostream *)readerError.field_2._M_local_buf,
                                   "BAM file is not properly sorted by coordinate");
          iVar2 = local_3f0;
          poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
          poVar5 = std::operator<<(poVar5,"Current alignment position: ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_dc);
          poVar5 = std::operator<<(poVar5," < previous alignment position: ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
          poVar5 = std::operator<<(poVar5," on reference ID: ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_e0);
          std::endl<char,std::char_traits<char>>(poVar5);
          std::__cxx11::string::string((string *)&local_378,"BamStandardIndex::Create",&local_3f5);
          std::__cxx11::stringbuf::str();
          BamIndex::SetErrorString(&this->super_BamIndex,&local_378,&local_330);
          std::__cxx11::string::~string((string *)&local_330);
          std::__cxx11::string::~string((string *)&local_378);
          std::__cxx11::stringstream::~stringstream((stringstream *)&readerError);
LAB_0019abf1:
          BaiReferenceEntry::~BaiReferenceEntry(&refEntry);
          BamAlignment::~BamAlignment((BamAlignment *)&message);
          this_00 = &indexFilename;
          goto LAB_0019ad51;
        }
        if (uVar8 == -1) {
          for (iVar2 = 0; iVar2 < (int)local_e0; iVar2 = iVar2 + 1) {
            readerError.field_2._M_allocated_capacity._0_4_ = 0;
            readerError.field_2._8_8_ = 0;
            readerError._M_dataplus._M_p._0_4_ = iVar2;
            WriteReferenceEntry(this,(BaiReferenceEntry *)&readerError);
            pBVar6 = (BamReaderPrivate *)&readerError;
            BaiReferenceEntry::~BaiReferenceEntry((BaiReferenceEntry *)&readerError);
          }
        }
        else {
          SaveAlignmentChunkToBin
                    ((BamStandardIndex *)pBVar6,&refEntry.Bins,&currentBin,&currentOffset,
                     &lastOffset);
          pBVar6 = (BamReaderPrivate *)this;
          WriteReferenceEntry(this,&refEntry);
          ClearReferenceEntry((BamStandardIndex *)pBVar6,&refEntry);
          while (uVar8 = uVar8 + 1, (int)uVar8 < (int)local_e0) {
            readerError.field_2._M_allocated_capacity._0_4_ = 0;
            readerError.field_2._8_8_ = 0;
            readerError._M_dataplus._M_p._0_4_ = uVar8;
            WriteReferenceEntry(this,(BaiReferenceEntry *)&readerError);
            pBVar6 = (BamReaderPrivate *)&readerError;
            BaiReferenceEntry::~BaiReferenceEntry((BaiReferenceEntry *)&readerError);
          }
          currentBin = (uint32_t)(ushort)local_d8[0]._0_2_;
          currentOffset = uVar3;
          local_3d8 = uVar3;
          uVar7 = local_e0;
        }
        local_3ec = 0xffffffff;
        refEntry.ID = local_e0;
        uVar8 = local_e0;
LAB_0019a89c:
        if ((ushort)local_d8[0]._0_2_ < 0x1249 && -1 < (int)uVar8) {
          pBVar6 = (BamReaderPrivate *)&message;
          readerError._M_dataplus._M_p._0_4_ =
               BamAlignment::GetEndPosition((BamAlignment *)pBVar6,false,false);
          SaveLinearOffsetEntry
                    ((BamStandardIndex *)pBVar6,&refEntry.LinearOffsets,&local_dc,
                     (int *)&readerError,&lastOffset);
        }
        if (local_3ec != (ushort)local_d8[0]._0_2_) {
          if (currentBin != 0xffffffff) {
            SaveAlignmentChunkToBin
                      ((BamStandardIndex *)pBVar6,&refEntry.Bins,&currentBin,&currentOffset,
                       &lastOffset);
          }
          currentBin = (uint32_t)(ushort)local_d8[0]._0_2_;
          uVar7 = local_e0;
          local_3ec = currentBin;
          currentOffset = uVar3;
          local_3d8 = uVar3;
          if ((int)local_e0 < 0) break;
        }
        iVar4 = BamReaderPrivate::Tell((this->super_BamIndex).m_reader);
        if (iVar4 <= (long)uVar3) {
          std::__cxx11::string::string
                    ((string *)&readerError,"BamStandardIndex::Create",(allocator *)&local_330);
          std::__cxx11::string::string((string *)&local_378,"calculating offsets failed",&local_3f5)
          ;
          BamIndex::SetErrorString(&this->super_BamIndex,&readerError,&local_378);
          std::__cxx11::string::~string((string *)&local_378);
          std::__cxx11::string::~string((string *)&readerError);
          goto LAB_0019abf1;
        }
        uVar3 = BamReaderPrivate::Tell((this->super_BamIndex).m_reader);
        lastOffset = uVar3;
        local_3f0 = local_dc;
      }
      iVar2 = local_3cc;
      if (uVar3 != local_3d8) {
        SaveAlignmentChunkToBin
                  ((BamStandardIndex *)pBVar6,&refEntry.Bins,&currentBin,&currentOffset,&lastOffset)
        ;
        WriteReferenceEntry(this,&refEntry);
      }
      while (uVar7 = uVar7 + 1, (int)uVar7 < iVar2) {
        readerError.field_2._M_allocated_capacity._0_4_ = 0;
        readerError.field_2._8_8_ = 0;
        readerError._M_dataplus._M_p._0_4_ = uVar7;
        WriteReferenceEntry(this,(BaiReferenceEntry *)&readerError);
        BaiReferenceEntry::~BaiReferenceEntry((BaiReferenceEntry *)&readerError);
      }
      BaiReferenceEntry::~BaiReferenceEntry(&refEntry);
      BamAlignment::~BamAlignment((BamAlignment *)&message);
      std::__cxx11::string::~string((string *)&indexFilename);
      bVar1 = BamReaderPrivate::Rewind((this->super_BamIndex).m_reader);
      if (bVar1) {
        return true;
      }
      BamReaderPrivate::GetErrorString_abi_cxx11_(&readerError,(this->super_BamIndex).m_reader);
      std::operator+(&message,"could not create index: \n\t",&readerError);
      std::__cxx11::string::string
                ((string *)&refEntry,"BamStandardIndex::Create",(allocator *)&indexFilename);
      BamIndex::SetErrorString(&this->super_BamIndex,(string *)&refEntry,&message);
    }
    else {
      BamReaderPrivate::GetErrorString_abi_cxx11_(&readerError,(this->super_BamIndex).m_reader);
      std::operator+(&message,"could not create index: \n\t",&readerError);
      std::__cxx11::string::string
                ((string *)&refEntry,"BamStandardIndex::Create",(allocator *)&indexFilename);
      BamIndex::SetErrorString(&this->super_BamIndex,(string *)&refEntry,&message);
    }
    std::__cxx11::string::~string((string *)&refEntry);
  }
  std::__cxx11::string::~string((string *)&message);
  this_00 = &readerError;
LAB_0019ad51:
  std::__cxx11::string::~string((string *)this_00);
  return false;
}

Assistant:

bool BamStandardIndex::Create()
{

    // skip if BamReader is invalid or not open
    if (m_reader == 0 || !m_reader->IsOpen()) {
        SetErrorString("BamStandardIndex::Create", "could not create index: reader is not open");
        return false;
    }

    // rewind BamReader
    if (!m_reader->Rewind()) {
        const std::string readerError = m_reader->GetErrorString();
        const std::string message = "could not create index: \n\t" + readerError;
        SetErrorString("BamStandardIndex::Create", message);
        return false;
    }

    try {

        // open new index file (read & write)
        std::string indexFilename = m_reader->Filename() + Extension();
        OpenFile(indexFilename, IBamIODevice::ReadWrite);

        // initialize BaiFileSummary with number of references
        const int& numReferences = m_reader->GetReferenceCount();
        ReserveForSummary(numReferences);

        // initialize output file
        WriteHeader();

        // set up bin, ID, offset, & coordinate markers
        const uint32_t defaultValue = 0xffffffffu;
        uint32_t currentBin = defaultValue;
        uint32_t lastBin = defaultValue;
        int32_t currentRefID = defaultValue;
        int32_t lastRefID = defaultValue;
        uint64_t currentOffset = (uint64_t)m_reader->Tell();
        uint64_t lastOffset = currentOffset;
        int32_t lastPosition = defaultValue;

        // iterate through alignments in BAM file
        BamAlignment al;
        BaiReferenceEntry refEntry;
        while (m_reader->LoadNextAlignment(al)) {

            // changed to new reference
            if (lastRefID != al.RefID) {

                // if not first reference, save previous reference data
                if (lastRefID != (int32_t)defaultValue) {

                    SaveAlignmentChunkToBin(refEntry.Bins, currentBin, currentOffset, lastOffset);
                    WriteReferenceEntry(refEntry);
                    ClearReferenceEntry(refEntry);

                    // write any empty references between (but *NOT* including) lastRefID & al.RefID
                    for (int i = lastRefID + 1; i < al.RefID; ++i) {
                        BaiReferenceEntry emptyEntry(i);
                        WriteReferenceEntry(emptyEntry);
                    }

                    // update bin markers
                    currentOffset = lastOffset;
                    currentBin = al.Bin;
                    lastBin = al.Bin;
                    currentRefID = al.RefID;
                }

                // otherwise, this is first pass
                // be sure to write any empty references up to (but *NOT* including) current RefID
                else {
                    for (int i = 0; i < al.RefID; ++i) {
                        BaiReferenceEntry emptyEntry(i);
                        WriteReferenceEntry(emptyEntry);
                    }
                }

                // update reference markers
                refEntry.ID = al.RefID;
                lastRefID = al.RefID;
                lastBin = defaultValue;
            }

            // if lastPosition greater than current alignment position - file not sorted properly
            else if (lastPosition > al.Position) {
                std::stringstream s;
                s << "BAM file is not properly sorted by coordinate" << std::endl
                  << "Current alignment position: " << al.Position
                  << " < previous alignment position: " << lastPosition
                  << " on reference ID: " << al.RefID << std::endl;
                SetErrorString("BamStandardIndex::Create", s.str());
                return false;
            }

            // if alignment's ref ID is valid & its bin is not a 'leaf'
            if ((al.RefID >= 0) && (al.Bin < 4681))
                SaveLinearOffsetEntry(refEntry.LinearOffsets, al.Position, al.GetEndPosition(),
                                      lastOffset);

            // changed to new BAI bin
            if (al.Bin != lastBin) {

                // if not first bin on reference, save previous bin data
                if (currentBin != defaultValue)
                    SaveAlignmentChunkToBin(refEntry.Bins, currentBin, currentOffset, lastOffset);

                // update markers
                currentOffset = lastOffset;
                currentBin = al.Bin;
                lastBin = al.Bin;
                currentRefID = al.RefID;

                // if invalid RefID, break out
                if (currentRefID < 0) break;
            }

            // make sure that current file pointer is beyond lastOffset
            if (m_reader->Tell() <= (int64_t)lastOffset) {
                SetErrorString("BamStandardIndex::Create", "calculating offsets failed");
                return false;
            }

            // update lastOffset & lastPosition
            lastOffset = m_reader->Tell();
            lastPosition = al.Position;
        }

        // after finishing alignments, if any data was read, check:
        if (lastOffset != currentOffset) {

            // store last alignment chunk to its bin, then write last reference entry with data
            SaveAlignmentChunkToBin(refEntry.Bins, currentBin, currentOffset, lastOffset);
            WriteReferenceEntry(refEntry);
        }

        // then write any empty references remaining at end of file
        for (int i = currentRefID + 1; i < numReferences; ++i) {
            BaiReferenceEntry emptyEntry(i);
            WriteReferenceEntry(emptyEntry);
        }

    } catch (BamException& e) {
        m_errorString = e.what();
        return false;
    }

    // rewind BamReader
    if (!m_reader->Rewind()) {
        const std::string readerError = m_reader->GetErrorString();
        const std::string message = "could not create index: \n\t" + readerError;
        SetErrorString("BamStandardIndex::Create", message);
        return false;
    }

    // return success
    return true;
}